

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrim<tinyusdz::GeomSubset>
          (Impl *this,Specifier *spec,Node *node,PathIndexToSpecIndexMap *psmap,GeomSubset *prim)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pathIndices;
  ostream *poVar2;
  PrimReconstructOptions local_229;
  undefined1 local_228 [7];
  PrimReconstructOptions reconstruct_options;
  ReferenceList refs;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream ss_e;
  undefined1 local_68 [8];
  PropertyMap properties;
  GeomSubset *prim_local;
  PathIndexToSpecIndexMap *psmap_local;
  Node *node_local;
  Specifier *spec_local;
  Impl *this_local;
  
  properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)prim;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         *)local_68);
  pathIndices = crate::CrateReader::Node::GetChildren(node);
  bVar1 = BuildPropertyMap(this,pathIndices,psmap,(PropertyMap *)local_68);
  if (bVar1) {
    ::std::
    pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
    ::
    pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>,_true>
              ((pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
                *)local_228);
    tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_229);
    local_229.strict_allowedToken_check = (bool)((this->_config).strict_allowedToken_check & 1);
    this_local._7_1_ =
         tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>
                   (spec,(PropertyMap *)local_68,(ReferenceList *)local_228,
                    (GeomSubset *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    &this->_warn,&this->_err,&local_229);
    ::std::
    pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
    ::~pair((pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
             *)local_228);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar2 = ::std::operator<<((ostream *)local_1e0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[USDC]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5dc);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1e0,"Failed to build PropertyMap.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          *)local_68);
  return this_local._7_1_;
}

Assistant:

bool USDCReader::Impl::ReconstructPrim(const Specifier &spec, const crate::CrateReader::Node &node,
                                       const PathIndexToSpecIndexMap &psmap,
                                       T *prim) {
  // Prim's properties are stored in its children nodes.
  prim::PropertyMap properties;
  if (!BuildPropertyMap(node.GetChildren(), psmap, &properties)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
  }

  prim::ReferenceList refs;  // dummy

  prim::PrimReconstructOptions reconstruct_options;
  reconstruct_options.strict_allowedToken_check = _config.strict_allowedToken_check;

  if (!prim::ReconstructPrim<T>(spec, properties, refs, prim, &_warn, &_err, reconstruct_options)) {
    return false;
  }

  return true;
}